

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpace.cpp
# Opt level: O1

shared_ptr<mnf::Manifold> __thiscall mnf::RealSpace::getNewCopy_(RealSpace *this)

{
  RealSpace *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  RealSpace *in_RSI;
  shared_ptr<mnf::Manifold> sVar1;
  shared_ptr<mnf::RealSpace> copy;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  this_00 = (RealSpace *)operator_new(0x78);
  RealSpace(this_00,in_RSI);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mnf::RealSpace*>
            (&local_20,this_00);
  (this->super_Manifold)._vptr_Manifold = (_func_int **)this_00;
  (this->super_Manifold).super_RefCounter = 0;
  (this->super_Manifold).super_ValidManifold = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_Manifold).super_RefCounter =
       local_20._M_pi;
  sVar1.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_Manifold
  ;
  return (shared_ptr<mnf::Manifold>)
         sVar1.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Manifold> RealSpace::getNewCopy_() const
{
  std::shared_ptr<RealSpace> copy(new RealSpace(*this));
  return copy;
}